

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pasteboard.c
# Opt level: O2

void wpe_pasteboard_string_vector_free(wpe_pasteboard_string_vector *vector)

{
  long lVar1;
  uint64_t i;
  ulong uVar2;
  
  if (vector->strings != (wpe_pasteboard_string *)0x0) {
    lVar1 = 0;
    for (uVar2 = 0; uVar2 < vector->length; uVar2 = uVar2 + 1) {
      wpe_pasteboard_string_free((wpe_pasteboard_string *)((long)&vector->strings->data + lVar1));
      lVar1 = lVar1 + 0x10;
    }
    free(vector->strings);
  }
  vector->strings = (wpe_pasteboard_string *)0x0;
  vector->length = 0;
  return;
}

Assistant:

void
wpe_pasteboard_string_vector_free(struct wpe_pasteboard_string_vector* vector)
{
    if (vector->strings) {
        for (uint64_t i = 0; i < vector->length; ++i)
            wpe_pasteboard_string_free(&vector->strings[i]);
        wpe_free(vector->strings);
    }
    vector->strings = 0;
    vector->length = 0;
}